

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

bool __thiscall
GEO::Delaunay2d::create_first_triangle(Delaunay2d *this,index_t *iv0,index_t *iv1,index_t *iv2)

{
  uint uVar1;
  index_t iVar2;
  index_t iVar3;
  signed_index_t v2_00;
  signed_index_t v3;
  double *pdVar4;
  double *pdVar5;
  double *p2;
  bool bVar6;
  bool local_69;
  index_t lv2;
  index_t lv1;
  index_t e_2;
  index_t e_1;
  signed_index_t v2;
  signed_index_t v1;
  index_t e;
  index_t t [3];
  index_t t0;
  Sign s;
  index_t *iv2_local;
  index_t *iv1_local;
  index_t *iv0_local;
  Delaunay2d *this_local;
  
  iVar2 = Delaunay::nb_vertices(&this->super_Delaunay);
  if (iVar2 < 3) {
    this_local._7_1_ = false;
  }
  else {
    *iv0 = 0;
    *iv1 = 1;
    while( true ) {
      uVar1 = *iv1;
      iVar2 = Delaunay::nb_vertices(&this->super_Delaunay);
      local_69 = false;
      if (uVar1 < iVar2) {
        pdVar4 = Delaunay::vertex_ptr(&this->super_Delaunay,*iv0);
        pdVar5 = Delaunay::vertex_ptr(&this->super_Delaunay,*iv1);
        local_69 = PCK::points_are_identical_2d(pdVar4,pdVar5);
      }
      if (local_69 == false) break;
      *iv1 = *iv1 + 1;
    }
    iVar2 = *iv1;
    iVar3 = Delaunay::nb_vertices(&this->super_Delaunay);
    if (iVar2 == iVar3) {
      this_local._7_1_ = false;
    }
    else {
      *iv2 = *iv1 + 1;
      t[2] = 0;
      while( true ) {
        uVar1 = *iv2;
        iVar2 = Delaunay::nb_vertices(&this->super_Delaunay);
        bVar6 = false;
        if (uVar1 < iVar2) {
          pdVar4 = Delaunay::vertex_ptr(&this->super_Delaunay,*iv0);
          pdVar5 = Delaunay::vertex_ptr(&this->super_Delaunay,*iv1);
          p2 = Delaunay::vertex_ptr(&this->super_Delaunay,*iv2);
          t[2] = PCK::orient_2d(pdVar4,pdVar5,p2);
          bVar6 = t[2] == ZERO;
        }
        if (!bVar6) break;
        *iv2 = *iv2 + 1;
      }
      iVar2 = *iv2;
      iVar3 = Delaunay::nb_vertices(&this->super_Delaunay);
      if (iVar2 == iVar3) {
        this_local._7_1_ = false;
      }
      else {
        if (t[2] == 0xffffffff) {
          std::swap<unsigned_int>(iv1,iv2);
        }
        t[1] = new_triangle(this,*iv0,*iv1,*iv2);
        for (v2 = 0; iVar2 = t[1], (uint)v2 < 3; v2 = v2 + 1) {
          iVar3 = triangle_edge_vertex(v2,1);
          v2_00 = triangle_vertex(this,iVar2,iVar3);
          iVar2 = t[1];
          iVar3 = triangle_edge_vertex(v2,0);
          v3 = triangle_vertex(this,iVar2,iVar3);
          iVar2 = new_triangle(this,-1,v2_00,v3);
          (&v1)[(uint)v2] = iVar2;
        }
        for (lv1 = 0; lv1 < 3; lv1 = lv1 + 1) {
          set_triangle_adjacent(this,(&v1)[lv1],0,t[1]);
          set_triangle_adjacent(this,t[1],lv1,(&v1)[lv1]);
        }
        for (lv2 = 0; lv2 < 3; lv2 = lv2 + 1) {
          iVar2 = triangle_edge_vertex(lv2,1);
          iVar3 = triangle_edge_vertex(lv2,0);
          set_triangle_adjacent(this,(&v1)[lv2],1,(&v1)[iVar2]);
          set_triangle_adjacent(this,(&v1)[lv2],2,(&v1)[iVar3]);
        }
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Delaunay2d::create_first_triangle(
        index_t& iv0, index_t& iv1, index_t& iv2
    ) {
        if(nb_vertices() < 3) {
            return false;
        }

        iv0 = 0;

        iv1 = 1;
        while(
            iv1 < nb_vertices() &&
            PCK::points_are_identical_2d(
                vertex_ptr(iv0), vertex_ptr(iv1)
            )
        ) {
            ++iv1;
        }
        if(iv1 == nb_vertices()) {
            return false;
        }

        iv2 = iv1 + 1;
	Sign s = ZERO;
        while(
            iv2 < nb_vertices() &&  
	    (s = PCK::orient_2d(vertex_ptr(iv0), vertex_ptr(iv1), vertex_ptr(iv2))) == ZERO
	) {
            ++iv2;
        }
        if(iv2 == nb_vertices()) {
            return false;
        }
	if(s == NEGATIVE) {
	    std::swap(iv1,iv2);
	}
	    
        // Create the first triangle
        index_t t0 = new_triangle(
            signed_index_t(iv0), 
            signed_index_t(iv1), 
            signed_index_t(iv2)
        );

        // Create the first three virtual triangles surrounding it
        index_t t[3];
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            signed_index_t v1 = triangle_vertex(t0, triangle_edge_vertex(e,1));
            signed_index_t v2 = triangle_vertex(t0, triangle_edge_vertex(e,0));
            t[e] = new_triangle(VERTEX_AT_INFINITY, v1, v2);
        }

        // Connect the virtual triangles to the real one
        for(index_t e=0; e<3; ++e) {
            set_triangle_adjacent(t[e], 0, t0);
            set_triangle_adjacent(t0, e, t[e]);
        }

        // Interconnect the three virtual triangles along their common
        // edges
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            index_t lv1 = triangle_edge_vertex(e,1);
            index_t lv2 = triangle_edge_vertex(e,0);
            set_triangle_adjacent(t[e], 1, t[lv1]);
            set_triangle_adjacent(t[e], 2, t[lv2]);
        }

        return true;
    }